

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall ctemplate::BaseArena::set_handle_alignment(BaseArena *this,int align)

{
  bool bVar1;
  int align_local;
  BaseArena *this_local;
  
  if ((align < 1) || ((align & align - 1U) != 0)) {
    fprintf(_stderr,"Check failed: %s\n","align > 0 && 0 == (align & (align - 1))");
    exit(1);
  }
  if (this->block_size_ <= (ulong)(long)align) {
    fprintf(_stderr,"Check failed: %s\n","static_cast<size_t>(align) < block_size_");
    exit(1);
  }
  if (this->block_size_ % (ulong)(long)align != 0) {
    fprintf(_stderr,"Check failed: %s\n","(block_size_ % align) == 0");
    exit(1);
  }
  bVar1 = is_empty(this);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","is_empty()");
    exit(1);
  }
  this->handle_alignment_ = align;
  this->handle_alignment_bits_ = 0;
  while (1 << ((byte)this->handle_alignment_bits_ & 0x1f) < this->handle_alignment_) {
    this->handle_alignment_bits_ = this->handle_alignment_bits_ + 1;
  }
  return;
}

Assistant:

void BaseArena::set_handle_alignment(int align) {
  CHECK(align > 0 && 0 == (align & (align - 1)));  // must be power of 2
  CHECK(static_cast<size_t>(align) < block_size_);
  CHECK((block_size_ % align) == 0);
  CHECK(is_empty());
  handle_alignment_ = align;
  handle_alignment_bits_ = 0;
  while ((1 << handle_alignment_bits_) < handle_alignment_) {
    ++handle_alignment_bits_;
  }
}